

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasStringPieceFields(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = *(int *)(descriptor + 4);
  if (0 < iVar2) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (*(int *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                  (ulong)*(byte *)(*(long *)(descriptor + 0x38) + 2 + lVar4) * 4) == 9) {
        google::protobuf::FieldDescriptor::cpp_string_type();
        iVar2 = *(int *)(descriptor + 4);
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x58;
    } while (lVar3 < iVar2);
  }
  if (*(int *)(descriptor + 0x80) < 1) {
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar1 = HasStringPieceFields((Descriptor *)(*(long *)(descriptor + 0x48) + lVar3),options);
      if (bVar1) {
        return bVar1;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x98;
    } while (lVar4 < *(int *)(descriptor + 0x80));
  }
  return bVar1;
}

Assistant:

static bool HasStringPieceFields(const Descriptor* descriptor,
                                 const Options& options) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (IsStringPieceField(descriptor->field(i), options)) return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasStringPieceFields(descriptor->nested_type(i), options)) return true;
  }
  return false;
}